

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# csharp_field_base.cc
# Opt level: O0

string * __thiscall
google::protobuf::compiler::csharp::FieldGeneratorBase::GetStringDefaultValueInternal_abi_cxx11_
          (string *__return_storage_ptr__,FieldGeneratorBase *this,FieldDescriptor *descriptor)

{
  bool bVar1;
  size_type x;
  char *in_RCX;
  string_view input;
  AlphaNum local_178;
  string_view local_148;
  AlphaNum local_138;
  AlphaNum local_108;
  string_view local_d8;
  string local_c8;
  AlphaNum local_a8;
  AlphaNum local_78;
  allocator<char> local_31;
  string_view local_30;
  FieldDescriptor *local_20;
  FieldDescriptor *descriptor_local;
  FieldGeneratorBase *this_local;
  
  local_20 = descriptor;
  descriptor_local = (FieldDescriptor *)this;
  this_local = (FieldGeneratorBase *)__return_storage_ptr__;
  local_30 = FieldDescriptor::default_value_string(descriptor);
  bVar1 = std::basic_string_view<char,_std::char_traits<char>_>::empty(&local_30);
  if (bVar1) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)__return_storage_ptr__,"\"\"",&local_31);
    std::allocator<char>::~allocator(&local_31);
  }
  else {
    absl::lts_20250127::AlphaNum::AlphaNum
              (&local_78,
               "global::System.Text.Encoding.UTF8.GetString(global::System.Convert.FromBase64String(\""
              );
    local_d8 = FieldDescriptor::default_value_string(local_20);
    input._M_str = in_RCX;
    input._M_len = (size_t)local_d8._M_str;
    StringToBase64_abi_cxx11_(&local_c8,(csharp *)local_d8._M_len,input);
    absl::lts_20250127::AlphaNum::AlphaNum<std::allocator<char>>(&local_a8,&local_c8);
    absl::lts_20250127::AlphaNum::AlphaNum(&local_108,"\"), 0, ");
    local_148 = FieldDescriptor::default_value_string(local_20);
    x = std::basic_string_view<char,_std::char_traits<char>_>::length(&local_148);
    absl::lts_20250127::AlphaNum::AlphaNum(&local_138,x);
    absl::lts_20250127::AlphaNum::AlphaNum(&local_178,")");
    absl::lts_20250127::StrCat<>
              (__return_storage_ptr__,&local_78,&local_a8,&local_108,&local_138,&local_178);
    std::__cxx11::string::~string((string *)&local_c8);
  }
  return __return_storage_ptr__;
}

Assistant:

std::string FieldGeneratorBase::GetStringDefaultValueInternal(const FieldDescriptor* descriptor) {
    if (descriptor->default_value_string().empty())
        return "\"\"";
    return absl::StrCat(
        "global::System.Text.Encoding.UTF8.GetString(global::System."
        "Convert.FromBase64String(\"",
        StringToBase64(descriptor->default_value_string()), "\"), 0, ",
        descriptor->default_value_string().length(), ")");
}